

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O3

void __thiscall AActorMover::PostBeginPlay(AActorMover *this)

{
  ActorFlags2 AVar1;
  AActor *pAVar2;
  TActorIterator<AActor> iterator;
  TActorIterator<AActor> local_18;
  
  APathFollower::PostBeginPlay(&this->super_APathFollower);
  local_18.super_FActorIterator.id = (this->super_APathFollower).super_AActor.args[3];
  local_18.super_FActorIterator.base = (AActor *)0x0;
  pAVar2 = TActorIterator<AActor>::Next(&local_18);
  (this->super_APathFollower).super_AActor.tracer.field_0.p = pAVar2;
  if (pAVar2 != (AActor *)0x0) {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      AVar1.Value = (pAVar2->flags2).Value;
      (this->super_APathFollower).super_AActor.special1 = (pAVar2->flags).Value;
      (this->super_APathFollower).super_AActor.special2 = AVar1.Value;
      return;
    }
    (this->super_APathFollower).super_AActor.tracer.field_0.p = (AActor *)0x0;
  }
  Printf("ActorMover %d: Can\'t find target %d\n",
         (ulong)(uint)(this->super_APathFollower).super_AActor.tid,
         (ulong)(uint)(this->super_APathFollower).super_AActor.args[3]);
  return;
}

Assistant:

void AActorMover::PostBeginPlay ()
{
	Super::PostBeginPlay ();

	TActorIterator<AActor> iterator (args[3]);
	tracer = iterator.Next ();

	if (tracer == NULL)
	{
		Printf ("ActorMover %d: Can't find target %d\n", tid, args[3]);
	}
	else
	{
		special1 = tracer->flags;
		special2 = tracer->flags2;
	}
}